

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong local_68;
  unsigned_long v;
  char *end;
  char *p_1;
  uint16_t len;
  uint16_t off;
  int found_at;
  http_parser_url_fields old_uf;
  http_parser_url_fields uf;
  char *p;
  state s;
  http_parser_url *u_local;
  int is_connect_local;
  size_t buflen_local;
  char *buf_local;
  
  p_1._4_4_ = 0;
  if (buflen == 0) {
    buf_local._4_4_ = 1;
  }
  else {
    u->field_set = 0;
    u->port = 0;
    p._4_4_ = s_req_spaces_before_url;
    if (is_connect != 0) {
      p._4_4_ = s_req_server_start;
    }
    _len = 7;
    for (_old_uf = buf; _old_uf < buf + buflen; _old_uf = _old_uf + 1) {
      p._4_4_ = parse_url_char(p._4_4_,*_old_uf);
      switch(p._4_4_) {
      case s_dead:
        return 1;
      default:
        __assert_fail("!\"Unexpected state\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                      ,0x9a9,
                      "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                     );
      case s_req_schema:
        found_at = 0;
        break;
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        goto LAB_00111f6b;
      case s_req_server_with_at:
        p_1._4_4_ = 1;
      case s_req_server:
        found_at = 1;
        break;
      case s_req_path:
        found_at = 3;
        break;
      case s_req_query_string:
        found_at = 4;
        break;
      case s_req_fragment:
        found_at = 5;
      }
      if (found_at == _len) {
        u->field_data[(uint)found_at].len = u->field_data[(uint)found_at].len + 1;
      }
      else {
        u->field_data[(uint)found_at].off = (short)_old_uf - (short)buf;
        u->field_data[(uint)found_at].len = 1;
        u->field_set = u->field_set | (ushort)(1 << (sbyte)found_at);
        _len = found_at;
      }
LAB_00111f6b:
    }
    if (((u->field_set & 1) == 0) || ((u->field_set & 2) != 0)) {
      if (((u->field_set & 2) == 0) || (iVar3 = http_parse_host(buf,u,p_1._4_4_), iVar3 == 0)) {
        if ((is_connect == 0) || (u->field_set == 6)) {
          if ((u->field_set & 4) != 0) {
            uVar1 = u->field_data[2].off;
            uVar2 = u->field_data[2].len;
            if (buflen < (ulong)(long)(int)((uint)uVar1 + (uint)uVar2)) {
              __assert_fail("off + len <= buflen && \"Port number overflow\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                            ,0x9d8,
                            "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                           );
            }
            local_68 = 0;
            for (end = buf + (int)(uint)uVar1;
                end < buf + (long)(int)(uint)uVar2 + (long)(int)(uint)uVar1; end = end + 1) {
              local_68 = (long)(*end + -0x30) + local_68 * 10;
              if (0xffff < local_68) {
                return 1;
              }
            }
            u->port = (uint16_t)local_68;
          }
          buf_local._4_4_ = 0;
        }
        else {
          buf_local._4_4_ = 1;
        }
      }
      else {
        buf_local._4_4_ = 1;
      }
    }
    else {
      buf_local._4_4_ = 1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}